

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void luaG_callerror(lua_State *L,TValue *o)

{
  char *kind_00;
  char *local_40;
  char *extra;
  char *kind;
  char *name;
  CallInfo *ci;
  TValue *o_local;
  lua_State *L_local;
  
  name = (char *)L->ci;
  kind = (char *)0x0;
  ci = (CallInfo *)o;
  o_local = (TValue *)L;
  kind_00 = funcnamefromcall(L,(CallInfo *)name,&kind);
  if (kind_00 == (char *)0x0) {
    local_40 = varinfo((lua_State *)o_local,(TValue *)ci);
  }
  else {
    local_40 = formatvarinfo((lua_State *)o_local,kind_00,kind);
  }
  typeerror((lua_State *)o_local,(TValue *)ci,"call",local_40);
}

Assistant:

l_noret luaG_callerror (lua_State *L, const TValue *o) {
  CallInfo *ci = L->ci;
  const char *name = NULL;  /* to avoid warnings */
  const char *kind = funcnamefromcall(L, ci, &name);
  const char *extra = kind ? formatvarinfo(L, kind, name) : varinfo(L, o);
  typeerror(L, o, "call", extra);
}